

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O0

void cppcms::impl::todec<unsigned_short>(unsigned_short v,char *buf)

{
  char cVar1;
  char *in_RSI;
  unsigned_short in_DI;
  char tmp;
  char *begin;
  char *local_18;
  char *local_10 [2];
  
  if (in_DI == 0) {
    *in_RSI = '0';
    in_RSI[1] = '\0';
  }
  else {
    local_18 = (char *)0x0;
    local_10[0] = in_RSI;
    details::decimal_traits<false>::conv<unsigned_short>(in_DI,&local_18,local_10);
    *local_10[0] = '\0';
    for (; local_10[0] = local_10[0] + -1, local_18 < local_10[0]; local_18 = local_18 + 1) {
      cVar1 = *local_18;
      *local_18 = *local_10[0];
      *local_10[0] = cVar1;
    }
  }
  return;
}

Assistant:

void todec(Integer v,char *buf)
		{
			typedef std::numeric_limits<Integer> limits;
			if(v == 0) {
				*buf++ = '0';
				*buf++ = 0;
				return;
			}
			char *begin=0;

			details::decimal_traits<limits::is_signed>::conv(v,begin,buf);
			
			*buf-- = 0;
			while(begin < buf) {
				char tmp = *begin;
				*begin = *buf;
				*buf = tmp;
				buf--;
				begin++;
			}
		}